

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL Js::JavascriptProxy::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *requestContext,PropertyOperationFlags flags)

{
  code *pcVar1;
  anon_class_48_6_a93b9762 implicitCall;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  ThreadContext *pTVar5;
  JavascriptProxy *this;
  RecyclableObject *pRVar6;
  RecyclableObject *obj_00;
  JavascriptFunction *function;
  undefined4 *puVar7;
  Var pvVar8;
  Var pvVar9;
  PropertyRecord *this_00;
  char16 *pcVar10;
  PropertyDescriptor *local_118;
  byte local_101;
  BOOL settingConfigFalse;
  BOOL isExtensible;
  BOOL hasProperty;
  PropertyDescriptor targetDescriptor;
  BOOL defineResult;
  Var definePropertyResult;
  Var propertyName;
  Var descVar;
  JavascriptFunction *defineOwnPropertyMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  JavascriptProxy *proxy;
  ThreadContext *threadContext;
  PropertyOperationFlags flags_local;
  ScriptContext *requestContext_local;
  bool throwOnError_local;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  RecyclableObject *obj_local;
  
  pTVar5 = ScriptContext::GetThreadContext(requestContext);
  ThreadContext::ProbeStack(pTVar5,0xc00,requestContext,(PVOID)0x0);
  pTVar5 = ScriptContext::GetThreadContext(requestContext);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar5);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
    obj_local._4_4_ = 0;
  }
  else {
    this = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    pRVar6 = MarshalHandler(this,requestContext);
    if (pRVar6 == (RecyclableObject *)0x0) {
      bVar2 = ThreadContext::RecordImplicitException(pTVar5);
      if (bVar2) {
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"definePropertyDescriptor");
      }
      obj_local._4_4_ = 0;
    }
    else {
      obj_00 = MarshalTarget(this,requestContext);
      function = GetMethodHelper(this,0x19c,requestContext);
      bVar2 = ScriptContext::IsHeapEnumInProgress(requestContext);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x6cc,"(!requestContext->IsHeapEnumInProgress())",
                                    "!requestContext->IsHeapEnumInProgress()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (function == (JavascriptFunction *)0x0) {
        obj_local._4_4_ =
             Js::JavascriptOperators::DefineOwnPropertyDescriptor
                       (obj_00,propId,descriptor,throwOnError,requestContext,flags);
      }
      else {
        pvVar8 = Js::JavascriptOperators::FromPropertyDescriptor(descriptor,requestContext);
        pvVar9 = GetName(requestContext,propId);
        implicitCall.defineOwnPropertyMethod = function;
        implicitCall.threadContext = pTVar5;
        implicitCall.handlerObj = pRVar6;
        implicitCall.targetObj = obj_00;
        implicitCall.propertyName = pvVar9;
        implicitCall.descVar = pvVar8;
        pvVar8 = ThreadContext::
                 ExecuteImplicitCall<Js::JavascriptProxy::DefineOwnPropertyDescriptor(Js::RecyclableObject*,int,Js::PropertyDescriptor_const&,bool,Js::ScriptContext*,Js::PropertyOperationFlags)::__0>
                           (pTVar5,(RecyclableObject *)function,ImplicitCall_Accessor,implicitCall);
        targetDescriptor._44_4_ = JavascriptConversion::ToBoolean(pvVar8,requestContext);
        if (targetDescriptor._44_4_ == 0) {
          if ((throwOnError) && ((flags & PropertyOperation_StrictMode) != PropertyOperation_None))
          {
            this_00 = ScriptContext::GetPropertyName(requestContext,propId);
            pcVar10 = PropertyRecord::GetBuffer(this_00);
            JavascriptError::ThrowTypeErrorVar(requestContext,-0x7ff5e9d4,L"defineProperty",pcVar10)
            ;
          }
          obj_local._4_4_ = 0;
        }
        else {
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&isExtensible);
          BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                            (obj_00,propId,requestContext,(PropertyDescriptor *)&isExtensible);
          iVar4 = (*(obj_00->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x33])();
          bVar2 = PropertyDescriptor::ConfigurableSpecified(descriptor);
          local_101 = 0;
          if (bVar2) {
            bVar2 = PropertyDescriptor::IsConfigurable(descriptor);
            local_101 = bVar2 ^ 0xff;
          }
          if (BVar3 == 0) {
            if ((iVar4 == 0) || ((local_101 & 1) != 0)) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
            }
          }
          else {
            if (BVar3 == 0) {
              local_118 = (PropertyDescriptor *)0x0;
            }
            else {
              local_118 = (PropertyDescriptor *)&isExtensible;
            }
            BVar3 = Js::JavascriptOperators::IsCompatiblePropertyDescriptor
                              (descriptor,local_118,iVar4 != 0,true,requestContext);
            if (BVar3 == 0) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
            }
            if (((local_101 & 1) != 0) &&
               (bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&isExtensible),
               bVar2)) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
            }
          }
          obj_local._4_4_ = 1;
        }
      }
    }
  }
  return obj_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::DefineOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* requestContext, PropertyOperationFlags flags)
    {
        // #sec-proxy-object-internal-methods-and-internal-slots-defineownproperty-p-desc
        PROBE_STACK(requestContext, Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        JavascriptProxy* proxy = VarTo<JavascriptProxy>(obj);

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be O.[[ProxyHandler]].
        RecyclableObject *handlerObj = proxy->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        //4. Assert: Type(handler) is Object.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("definePropertyDescriptor"));
        }

        //5. Let target be O.[[ProxyTarget]].
        RecyclableObject *targetObj = proxy->MarshalTarget(requestContext);

        //6. Let trap be ? GetMethod(handler, "defineProperty").
        //7. If trap is undefined, then
        //a. Return ? target.[[DefineOwnProperty]](P, Desc).
        JavascriptFunction* defineOwnPropertyMethod = proxy->GetMethodHelper(PropertyIds::defineProperty, requestContext);

        Assert(!requestContext->IsHeapEnumInProgress());
        if (nullptr == defineOwnPropertyMethod)
        {
            return JavascriptOperators::DefineOwnPropertyDescriptor(targetObj, propId, descriptor, throwOnError, requestContext, flags);
        }

        //8. Let descObj be FromPropertyDescriptor(Desc).
        //9. Let booleanTrapResult be ToBoolean(? Call(trap, handler, << target, P, descObj >> )).
        //10. If booleanTrapResult is false, then return false.
        //11. Let targetDesc be ? target.[[GetOwnProperty]](P).
        Var descVar = JavascriptOperators::FromPropertyDescriptor(descriptor, requestContext);

        Var propertyName = GetName(requestContext, propId);

        Var definePropertyResult = threadContext->ExecuteImplicitCall(defineOwnPropertyMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, defineOwnPropertyMethod, CallInfo(CallFlags_Value, 4), handlerObj, targetObj, propertyName, descVar);
        });

        BOOL defineResult = JavascriptConversion::ToBoolean(definePropertyResult, requestContext);
        if (!defineResult)
        {
            if (throwOnError && flags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext,
                    JSERR_ProxyHandlerReturnedFalse,
                    _u("defineProperty"),
                    requestContext->GetPropertyName(propId)->GetBuffer()
                );
            }
            return defineResult;
        }

        //12. Let extensibleTarget be ? IsExtensible(target).
        //13. If Desc has a[[Configurable]] field and if Desc.[[Configurable]] is false, then
        //    a.Let settingConfigFalse be true.
        //14. Else let settingConfigFalse be false.
        //15. If targetDesc is undefined, then
        //    a.If extensibleTarget is false, then throw a TypeError exception.
        //    b.If settingConfigFalse is true, then throw a TypeError exception.
        //16. Else targetDesc is not undefined,
        //    a.If IsCompatiblePropertyDescriptor(extensibleTarget, Desc, targetDesc) is false, then throw a TypeError exception.
        //    b.If settingConfigFalse is true and targetDesc.[[Configurable]] is true, then throw a TypeError exception.
        //17. Return true.
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propId, requestContext, &targetDescriptor);
        BOOL isExtensible = targetObj->IsExtensible();
        BOOL settingConfigFalse = (descriptor.ConfigurableSpecified() && !descriptor.IsConfigurable());
        if (!hasProperty)
        {
            if (!isExtensible || settingConfigFalse)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
        }
        else
        {
            if (!JavascriptOperators::IsCompatiblePropertyDescriptor(descriptor, hasProperty? &targetDescriptor : nullptr, !!isExtensible, true, requestContext))
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
            if (settingConfigFalse && targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
        }
        return TRUE;
    }